

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall OpenMesh::PropertyT<float>::clear(PropertyT<float> *this)

{
  pointer pfVar1;
  
  pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
    return;
  }
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }